

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int copy_file(char *src,char *dst)

{
  FILE *__stream;
  FILE *__s;
  char *in_RSI;
  char *in_RDI;
  FILE *o;
  FILE *i;
  uchar buf [4096];
  size_t nwrite;
  size_t nread;
  bool local_1039;
  undefined1 local_1028 [4096];
  size_t local_28;
  size_t local_20;
  char *local_18;
  int local_4;
  
  local_18 = in_RSI;
  __stream = fopen(in_RDI,"rb");
  __s = fopen(local_18,"wb");
  if ((__stream == (FILE *)0x0) || (__s == (FILE *)0x0)) {
    local_4 = 0;
  }
  else {
    do {
      local_20 = fread(local_1028,1,0x1000,__stream);
      if (local_20 == 0) {
        local_28 = 0;
      }
      else {
        local_28 = fwrite(local_1028,1,local_20,__s);
      }
      local_1039 = local_20 != 0 && local_20 == local_28;
    } while (local_1039);
    fclose(__stream);
    fclose(__s);
    if (local_28 == 0) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int copy_file(const char* src, const char* dst)
{
#ifdef _WIN32
    return CopyFile(src, dst, FALSE);
#else
    size_t nread, nwrite;
    unsigned char buf[4096];
    FILE* i = fopen(src, "rb");
    FILE* o = fopen(dst, "wb");

    if (i == NULL || o == NULL)
        return 0;

    do
    {
        nread = fread(buf, 1, 4096, i);
        if (nread)
            nwrite = fwrite(buf, 1, nread, o);
        else
            nwrite = 0;
    } while (nread > 0 && nread == nwrite);

    fclose(i);
    fclose(o);

    if (nwrite)
        return 0;

    return 1;
#endif
}